

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O0

Comparison __thiscall
FreqComparator<false,_OccurenceTiebreak>::compare
          (FreqComparator<false,_OccurenceTiebreak> *this,uint s1,uint s2)

{
  uint i2;
  uint i1;
  Comparison CVar1;
  Symbol *pSVar2;
  SymbolType *in_RDI;
  Comparison res;
  uint c2;
  uint c1;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  pSVar2 = SymbolComparator::getSymbol
                     ((SymbolComparator *)
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  i2 = Kernel::Signature::Symbol::usageCnt(pSVar2);
  pSVar2 = SymbolComparator::getSymbol
                     ((SymbolComparator *)CONCAT44(i2,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
  i1 = Kernel::Signature::Symbol::usageCnt(pSVar2);
  CVar1 = Lib::Int::compare(i1,i2);
  if (CVar1 == EQUAL) {
    OccurenceTiebreak::OccurenceTiebreak((OccurenceTiebreak *)&stack0xffffffffffffffe3,*in_RDI);
    CVar1 = OccurenceTiebreak::compare
                      ((OccurenceTiebreak *)CONCAT44(CVar1,in_stack_ffffffffffffffe0),
                       (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  return CVar1;
}

Assistant:

Comparison compare(unsigned s1, unsigned s2)
  {
    unsigned c1 = getSymbol(s1)->usageCnt();
    unsigned c2 = getSymbol(s2)->usageCnt();
    // note that we have: "rare is large" (unless reverted)
    Comparison res = revert ? Int::compare(c1,c2) : Int::compare(c2,c1);
    if(res==EQUAL){
      // fallback to Inner
      res = InnerComparator(_symType).compare(s1,s2);
    }
    return res;
  }